

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bump_impl.hpp
# Opt level: O3

void __thiscall
tao::pegtl::internal::
memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::bump(memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *this,size_t in_count)

{
  size_t *psVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  
  pcVar2 = (this->m_current).data;
  if (in_count != 0) {
    sVar3 = (this->m_current).line;
    sVar5 = (this->m_current).byte_in_line;
    sVar4 = 0;
    do {
      if (pcVar2[sVar4] == '\n') {
        sVar3 = sVar3 + 1;
        (this->m_current).line = sVar3;
        sVar5 = 0;
      }
      else {
        sVar5 = sVar5 + 1;
      }
      (this->m_current).byte_in_line = sVar5;
      sVar4 = sVar4 + 1;
    } while (in_count != sVar4);
  }
  psVar1 = &(this->m_current).byte;
  *psVar1 = *psVar1 + in_count;
  (this->m_current).data = pcVar2 + in_count;
  return;
}

Assistant:

inline void bump( iterator& iter, const std::size_t count, const int ch ) noexcept
         {
            for( std::size_t i = 0; i < count; ++i ) {
               if( iter.data[ i ] == ch ) {
                  ++iter.line;
                  iter.byte_in_line = 0;
               }
               else {
                  ++iter.byte_in_line;
               }
            }
            iter.byte += count;
            iter.data += count;
         }